

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

CPToken cp_next(CPState *cp)

{
  SBuf *sb;
  CPChar CVar1;
  byte *pbVar2;
  TValue *pTVar3;
  lua_State *L;
  byte bVar4;
  uint uVar5;
  CTypeID CVar6;
  StrScanFmt SVar7;
  uint uVar8;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar9;
  char *pcVar10;
  GCstr *pGVar11;
  int iVar12;
  ErrMsg em;
  long lVar13;
  char cVar14;
  uint uVar15;
  int iVar16;
  TValue local_38;
  
  sb = &cp->sb;
  (cp->sb).p.ptr32 = (cp->sb).b.ptr32;
  lVar13 = (long)cp->c;
  bVar4 = ""[lVar13 + 1];
  if (-1 < (char)bVar4) {
LAB_001529d1:
    uVar5 = (uint)lVar13;
    if ((int)uVar5 < 0xd) {
      if (((int)uVar5 < 0xb) && (uVar5 != 9)) {
        if (uVar5 != 10) {
          uVar15 = 0x103;
          if (uVar5 != 0) goto switchD_00152a18_caseD_23;
          goto LAB_00152e35;
        }
LAB_00152ac9:
        bVar4 = *cp->p;
        if (((bVar4 == 0xd) || (bVar4 == 10)) && (uVar5 != bVar4)) {
          cp->p = cp->p + 1;
        }
        cp->linenumber = cp->linenumber + 1;
      }
switchD_00152a18_caseD_20:
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      uVar5 = (uint)*pbVar2;
      cp->c = uVar5;
      if (uVar5 == 0x5c) {
        cp_get_bs(cp);
      }
      goto LAB_00152aff;
    }
    if ((int)uVar5 < 0x3c) {
      switch(uVar5) {
      case 0x20:
        goto switchD_00152a18_caseD_20;
      case 0x21:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar5 = cp_get_bs(cp);
        }
        uVar15 = 0x21;
        if (uVar5 != 0x3d) goto LAB_00152e35;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar5 = (uint)*pbVar2;
        cp->c = uVar5;
        uVar15 = 0x107;
        break;
      case 0x22:
      case 0x27:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar15 = (uint)*pbVar2;
        cp->c = uVar15;
        if (uVar15 == 0x5c) {
          cp_get_bs(cp);
        }
        uVar15 = cp->c;
        goto joined_r0x00152e92;
      case 0x23:
      case 0x25:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2e:
        goto switchD_00152a18_caseD_23;
      case 0x24:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar5 = cp_get_bs(cp);
        }
        if ((uVar5 == 0x24) || ((char)""[(long)(int)uVar5 + 1] < '\0')) {
          em = LJ_ERR_XSYNTAX;
          goto LAB_00153415;
        }
        pTVar3 = cp->param;
        if ((pTVar3 == (TValue *)0x0) || (L = cp->L, L->top <= pTVar3)) {
          cp_err(cp,LJ_ERR_FFI_NUMPARAM);
        }
        cp->param = pTVar3 + 1;
        uVar5 = (pTVar3->field_2).it;
        if (uVar5 == 0xfffffffb) {
          cp->str = (GCstr *)(ulong)(pTVar3->u32).lo;
          (cp->val).id = 0;
          cp->ct = cp->cts->tab;
          uVar15 = 0x100;
          goto LAB_00152e35;
        }
        if (uVar5 < 0xffff0000) {
          aVar9.i32 = (int32_t)pTVar3->n;
          goto LAB_00153309;
        }
        if (uVar5 != 0xfffffff5) {
          lj_err_argtype(L,(int)((ulong)((long)pTVar3 - (long)L->base) >> 3) + 1,"type parameter");
        }
        uVar5 = (uint)*(ushort *)((ulong)(pTVar3->u32).lo + 6);
        if (uVar5 == 0x15) {
          (cp->val).id = *(CTypeID *)((ulong)(pTVar3->u32).lo + 8);
        }
        else {
          (cp->val).id = uVar5;
        }
        uVar15 = 0x24;
        goto LAB_00152e35;
      case 0x26:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar5 = cp_get_bs(cp);
        }
        uVar15 = 0x26;
        if (uVar5 != 0x26) goto LAB_00152e35;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar5 = (uint)*pbVar2;
        cp->c = uVar5;
        uVar15 = 0x105;
        break;
      case 0x2d:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar5 = cp_get_bs(cp);
        }
        uVar15 = 0x2d;
        if (uVar5 != 0x3e) goto LAB_00152e35;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar5 = (uint)*pbVar2;
        cp->c = uVar5;
        uVar15 = 0x10c;
        break;
      case 0x2f:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar5 = cp_get_bs(cp);
        }
        if (uVar5 == 0x2a) {
          do {
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar4 = *pbVar2;
            uVar5 = (uint)bVar4;
            cp->c = (uint)bVar4;
            if (bVar4 == 0x5c) {
              uVar5 = cp_get_bs(cp);
            }
            while (uVar5 == 0x2a) {
              pbVar2 = (byte *)cp->p;
              cp->p = (char *)(pbVar2 + 1);
              bVar4 = *pbVar2;
              uVar5 = (uint)bVar4;
              cp->c = (uint)bVar4;
              if (bVar4 == 0x5c) {
                uVar5 = cp_get_bs(cp);
              }
              if (uVar5 == 0x2f) goto switchD_00152a18_caseD_20;
              uVar5 = cp->c;
            }
            uVar5 = cp->c;
            if ((uVar5 == 10) || (uVar5 == 0xd)) {
              bVar4 = *cp->p;
              if (((bVar4 == 0xd) || (bVar4 == 10)) && (uVar5 != bVar4)) {
                cp->p = cp->p + 1;
              }
              cp->linenumber = cp->linenumber + 1;
            }
          } while (uVar5 != 0);
          goto LAB_00152aff;
        }
        if (cp->c != 0x2f) {
          uVar15 = 0x2f;
          goto LAB_00152e35;
        }
        do {
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          bVar4 = *pbVar2;
          uVar5 = (uint)bVar4;
          cp->c = (uint)bVar4;
          if (bVar4 == 0x5c) {
            uVar5 = cp_get_bs(cp);
          }
        } while (((uVar5 != 10) && (uVar5 != 0xd)) && (cp->c != 0));
LAB_00152aff:
        lVar13 = (long)cp->c;
        bVar4 = ""[lVar13 + 1];
        if ((char)bVar4 < '\0') goto LAB_00152bc6;
        goto LAB_001529d1;
      default:
        if (uVar5 == 0xd) goto LAB_00152ac9;
switchD_00152a18_caseD_23:
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        uVar8 = (uint)*pbVar2;
        cp->c = uVar8;
        uVar15 = uVar5;
        if (uVar8 == 0x5c) {
          cp_get_bs(cp);
        }
        goto LAB_00152e35;
      }
    }
    else if ((int)uVar5 < 0x3e) {
      if (uVar5 == 0x3c) {
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar5 = cp_get_bs(cp);
        }
        if (uVar5 != 0x3d) {
          uVar15 = 0x3c;
          if (cp->c == 0x3c) {
            pbVar2 = (byte *)cp->p;
            cp->p = (char *)(pbVar2 + 1);
            bVar4 = *pbVar2;
            uVar5 = (uint)bVar4;
            cp->c = (uint)bVar4;
            uVar15 = 0x10a;
            goto LAB_00152e2c;
          }
          goto LAB_00152e35;
        }
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        uVar15 = 0x108;
      }
      else {
        if (uVar5 != 0x3d) goto switchD_00152a18_caseD_23;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar5 = cp_get_bs(cp);
        }
        uVar15 = 0x3d;
        if (uVar5 != 0x3d) goto LAB_00152e35;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        uVar15 = 0x106;
      }
    }
    else if (uVar5 == 0x3e) {
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar5 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar5 = cp_get_bs(cp);
      }
      if (uVar5 == 0x3d) {
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        uVar15 = 0x109;
      }
      else {
        uVar15 = 0x3e;
        if (cp->c != 0x3e) goto LAB_00152e35;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar5 = (uint)bVar4;
        cp->c = (uint)bVar4;
        uVar15 = 0x10b;
      }
    }
    else {
      if (uVar5 != 0x7c) goto switchD_00152a18_caseD_23;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar5 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar5 = cp_get_bs(cp);
      }
      uVar15 = 0x7c;
      if (uVar5 != 0x7c) goto LAB_00152e35;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar5 = (uint)bVar4;
      cp->c = (uint)bVar4;
      uVar15 = 0x104;
    }
LAB_00152e2c:
    if (uVar5 == 0x5c) {
      cp_get_bs(cp);
    }
    goto LAB_00152e35;
  }
LAB_00152bc6:
  if ((bVar4 & 8) == 0) {
    do {
      CVar1 = cp->c;
      uVar5 = (cp->sb).p.ptr32;
      pcVar10 = (char *)(ulong)uVar5;
      if ((cp->sb).e.ptr32 == uVar5) {
        pcVar10 = lj_buf_more2(sb,1);
      }
      *pcVar10 = (char)CVar1;
      (cp->sb).p.ptr32 = (int)pcVar10 + 1;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar5 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar5 = cp_get_bs(cp);
      }
    } while ((char)""[(long)(int)uVar5 + 1] < '\0');
    uVar5 = (cp->sb).b.ptr32;
    pGVar11 = lj_str_new(cp->L,(char *)(ulong)uVar5,(ulong)((cp->sb).p.ptr32 - uVar5));
    cp->str = pGVar11;
    CVar6 = lj_ctype_getname(cp->cts,&cp->ct,pGVar11,cp->tmask);
    (cp->val).id = CVar6;
    uVar5 = cp->ct->info;
    uVar15 = 0x100;
    if ((uVar5 & 0xf0000000) == 0xd0000000) {
      uVar15 = uVar5 & 0xffff;
    }
    goto LAB_00152e35;
  }
  do {
    CVar1 = cp->c;
    uVar5 = (cp->sb).p.ptr32;
    pcVar10 = (char *)(ulong)uVar5;
    if ((cp->sb).e.ptr32 == uVar5) {
      pcVar10 = lj_buf_more2(sb,1);
    }
    *pcVar10 = (char)CVar1;
    (cp->sb).p.ptr32 = (int)pcVar10 + 1;
    pbVar2 = (byte *)cp->p;
    cp->p = (char *)(pbVar2 + 1);
    bVar4 = *pbVar2;
    uVar5 = (uint)bVar4;
    cp->c = (uint)bVar4;
    if (bVar4 == 0x5c) {
      uVar5 = cp_get_bs(cp);
    }
  } while ((char)""[(long)(int)uVar5 + 1] < '\0');
  uVar5 = (cp->sb).p.ptr32;
  pcVar10 = (char *)(ulong)uVar5;
  if ((cp->sb).e.ptr32 == uVar5) {
    pcVar10 = lj_buf_more2(sb,1);
  }
  *pcVar10 = '\0';
  (cp->sb).p.ptr32 = (int)pcVar10 + 1;
  uVar5 = (cp->sb).b.ptr32;
  SVar7 = lj_strscan_scan((uint8_t *)(ulong)uVar5,(int)pcVar10 + ~uVar5 + 1,&local_38,0x10);
  if (SVar7 == STRSCAN_INT) {
    CVar6 = 9;
LAB_00152dcd:
    (cp->val).id = CVar6;
  }
  else {
    if (SVar7 == STRSCAN_U32) {
      CVar6 = 10;
      goto LAB_00152dcd;
    }
    if ((cp->mode & 0x20) == 0) {
      uVar5 = 0x102;
      em = LJ_ERR_XNUMBER;
LAB_00153415:
      cp_errmsg(cp,uVar5,em);
    }
  }
  (cp->val).field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)local_38.field_2.field_0;
LAB_00152de3:
  uVar15 = 0x102;
LAB_00152e35:
  cp->tok = uVar15;
  return uVar15;
joined_r0x00152e92:
  if (uVar15 == uVar5) goto LAB_00152e98;
  if (uVar15 != 0x5c) {
    if (uVar15 != 0) goto LAB_00152fbe;
LAB_00153408:
    uVar5 = 0x103;
    em = LJ_ERR_XSTR;
    goto LAB_00153415;
  }
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar15 = (uint)*pbVar2;
  cp->c = uVar15;
  if (uVar15 == 0x5c) {
    uVar15 = cp_get_bs(cp);
  }
  switch(uVar15) {
  case 0x6e:
    uVar15 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
    goto switchD_00153028_caseD_6f;
  case 0x72:
    uVar15 = 0xd;
    break;
  case 0x74:
    uVar15 = 9;
    break;
  case 0x76:
    uVar15 = 0xb;
    break;
  case 0x78:
    iVar16 = 0;
    while( true ) {
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar15 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar15 = cp_get_bs(cp);
      }
      if ((""[(long)(int)uVar15 + 1] & 0x10) == 0) break;
      uVar15 = cp->c;
      iVar12 = (uVar15 & 0xf) + 9;
      if ((""[(long)(int)uVar15 + 1] & 8) != 0) {
        iVar12 = uVar15 - 0x30;
      }
      iVar16 = iVar16 * 0x10 + iVar12;
    }
    uVar15 = (cp->sb).p.ptr32;
    pcVar10 = (char *)(ulong)uVar15;
    if ((cp->sb).e.ptr32 == uVar15) {
      pcVar10 = lj_buf_more2(sb,1);
    }
    iVar12 = (int)pcVar10;
    *pcVar10 = (char)iVar16;
    goto LAB_001531a0;
  default:
    switch(uVar15) {
    case 0x61:
      uVar15 = 7;
      break;
    case 0x62:
      uVar15 = 8;
      break;
    case 99:
    case 100:
      goto switchD_00153028_caseD_6f;
    case 0x65:
      uVar15 = 0x1b;
      break;
    case 0x66:
      uVar15 = 0xc;
      break;
    default:
      if (uVar15 == 0) goto LAB_00153408;
switchD_00153028_caseD_6f:
      if ((""[(long)(int)uVar15 + 1] & 8) == 0) break;
      pbVar2 = (byte *)cp->p;
      cp->p = (char *)(pbVar2 + 1);
      bVar4 = *pbVar2;
      uVar8 = (uint)bVar4;
      cp->c = (uint)bVar4;
      if (bVar4 == 0x5c) {
        uVar8 = cp_get_bs(cp);
      }
      cVar14 = (char)uVar15 + -0x30;
      if ((""[(long)(int)uVar8 + 1] & 8) != 0) {
        CVar1 = cp->c;
        pbVar2 = (byte *)cp->p;
        cp->p = (char *)(pbVar2 + 1);
        bVar4 = *pbVar2;
        uVar15 = (uint)bVar4;
        cp->c = (uint)bVar4;
        if (bVar4 == 0x5c) {
          uVar15 = cp_get_bs(cp);
        }
        cVar14 = (char)CVar1 + cVar14 * '\b' + -0x30;
        if ((""[(long)(int)uVar15 + 1] & 8) != 0) {
          cVar14 = (char)cp->c + cVar14 * '\b' + -0x30;
          pbVar2 = (byte *)cp->p;
          cp->p = (char *)(pbVar2 + 1);
          uVar15 = (uint)*pbVar2;
          cp->c = uVar15;
          if (uVar15 == 0x5c) {
            cp_get_bs(cp);
          }
        }
      }
      uVar15 = (cp->sb).p.ptr32;
      pcVar10 = (char *)(ulong)uVar15;
      if ((cp->sb).e.ptr32 == uVar15) {
        pcVar10 = lj_buf_more2(sb,1);
      }
      iVar12 = (int)pcVar10;
      *pcVar10 = cVar14;
LAB_001531a0:
      (sb->p).ptr32 = iVar12 + 1;
      goto LAB_00152fed;
    }
  }
LAB_00152fbe:
  uVar8 = (cp->sb).p.ptr32;
  pcVar10 = (char *)(ulong)uVar8;
  if ((cp->sb).e.ptr32 == uVar8) {
    pcVar10 = lj_buf_more2(sb,1);
  }
  *pcVar10 = (char)uVar15;
  (cp->sb).p.ptr32 = (int)pcVar10 + 1;
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar15 = (uint)*pbVar2;
  cp->c = uVar15;
  if (uVar15 == 0x5c) {
    cp_get_bs(cp);
  }
LAB_00152fed:
  uVar15 = cp->c;
  goto joined_r0x00152e92;
LAB_00152e98:
  pbVar2 = (byte *)cp->p;
  cp->p = (char *)(pbVar2 + 1);
  uVar15 = (uint)*pbVar2;
  cp->c = uVar15;
  if (uVar15 == 0x5c) {
    cp_get_bs(cp);
  }
  if (uVar5 == 0x22) {
    uVar5 = (cp->sb).b.ptr32;
    pGVar11 = lj_str_new(cp->L,(char *)(ulong)uVar5,(ulong)((cp->sb).p.ptr32 - uVar5));
    cp->str = pGVar11;
    uVar15 = 0x101;
    goto LAB_00152e35;
  }
  uVar5 = (cp->sb).b.ptr32;
  if ((cp->sb).p.ptr32 - uVar5 != 1) {
    cp_err_token(cp,0x27);
  }
  aVar9 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(int)*(char *)(ulong)uVar5;
LAB_00153309:
  (cp->val).field_0 = aVar9;
  (cp->val).id = 9;
  goto LAB_00152de3;
}

Assistant:

static LJ_NOINLINE CPToken cp_next(CPState *cp)
{
  return (cp->tok = cp_next_(cp));
}